

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

SQInteger __thiscall
SQClass::Next(SQClass *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQWeakRef *pSVar3;
  SQTable *pSVar4;
  SQClassMember *pSVar5;
  SQTable *pSVar6;
  uint uVar7;
  SQObjectType SVar8;
  SQInteger SVar9;
  ulong uVar10;
  SQObjectType *pSVar11;
  SQObjectType *pSVar12;
  SQObjectPtr oval;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar9 = SQTable::Next(this->_members,false,refpos,outkey,&local_28);
  if (SVar9 != -1) {
    uVar7 = local_28.super_SQObject._unVal._0_4_ & 0xffffff;
    if ((local_28.super_SQObject._unVal._0_4_ >> 0x18 & 1) == 0) {
      pSVar11 = (SQObjectType *)
                ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type +
                (ulong)(uVar7 << 5));
      pSVar12 = pSVar11 + 2;
      SVar8 = *pSVar11;
      if (SVar8 == OT_WEAKREF) {
        SVar8 = *(SQObjectType *)(*(undefined8 *)pSVar12 + 0x18);
        pSVar12 = (SQObjectType *)(*(undefined8 *)pSVar12 + 0x20);
      }
      pSVar3 = *(SQWeakRef **)pSVar12;
      SVar2 = (outval->super_SQObject)._type;
      pSVar4 = (outval->super_SQObject)._unVal.pTable;
      (outval->super_SQObject)._unVal.pWeakRef = pSVar3;
      (outval->super_SQObject)._type = SVar8;
      if ((SVar8 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
    else {
      pSVar5 = (this->_methods)._vals;
      uVar10 = (ulong)(uVar7 << 5);
      SVar8 = (outval->super_SQObject)._type;
      pSVar4 = (outval->super_SQObject)._unVal.pTable;
      pSVar6 = *(SQTable **)((long)&(pSVar5->val).super_SQObject._unVal + uVar10);
      (outval->super_SQObject)._unVal.pTable = pSVar6;
      SVar2 = *(SQObjectType *)((long)&(pSVar5->val).super_SQObject._type + uVar10);
      (outval->super_SQObject)._type = SVar2;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar8 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar9;
}

Assistant:

SQInteger SQClass::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQObjectPtr oval;
    SQInteger idx = _members->Next(false,refpos,outkey,oval);
    if(idx != -1) {
        if(_ismethod(oval)) {
            outval = _methods[_member_idx(oval)].val;
        }
        else {
            SQObjectPtr &o = _defaultvalues[_member_idx(oval)].val;
            outval = _realval(o);
        }
    }
    return idx;
}